

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O1

void __thiscall
xLearn::FMScore::calc_grad_sgd(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  real_t rVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  float fVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar19 [16];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_75;
  real_t local_74;
  real_t local_70;
  value_type_conflict1 local_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  auVar19 = in_ZMM4._0_16_;
  auVar17._4_60_ = in_register_00001244;
  auVar17._0_4_ = norm;
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = pg;
  auVar14 = auVar15._0_16_;
  local_74 = pg;
  local_70 = norm;
  if (norm < 0.0) {
    fVar13 = sqrtf(norm);
    auVar14 = ZEXT416((uint)local_74);
  }
  else {
    auVar18 = vsqrtss_avx(auVar17._0_16_,auVar17._0_16_);
    fVar13 = auVar18._0_4_;
  }
  uVar4 = *(uint *)(model + 0x48);
  lVar8 = *(long *)row;
  lVar9 = *(long *)(row + 8);
  if (lVar8 != lVar9) {
    lVar6 = *(long *)(model + 0x58);
    do {
      uVar12 = *(uint *)(lVar8 + 4);
      if (uVar12 < uVar4) {
        auVar16 = ZEXT416(*(uint *)(lVar6 + (ulong)uVar12 * 4));
        auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * auVar14._0_4_ * *(float *)(lVar8 + 8))),
                                  auVar16,ZEXT416((uint)(this->super_Score).regu_lambda_));
        auVar18 = vfnmadd132ss_fma(auVar18,auVar16,ZEXT416((uint)(this->super_Score).learning_rate_)
                                  );
        *(int *)(lVar6 + (ulong)uVar12 * 4) = auVar18._0_4_;
      }
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != lVar9);
  }
  auVar14 = vfnmadd213ss_fma(ZEXT416((uint)(this->super_Score).learning_rate_),auVar14,
                             ZEXT416(**(uint **)(model + 0x68)));
  **(uint **)(model + 0x68) = auVar14._0_4_;
  auVar14 = vcvtusi2ss_avx512f(auVar19,*(undefined4 *)(model + 0x50));
  auVar14 = ZEXT416((uint)(auVar14._0_4_ * 0.25));
  auVar14 = vroundss_avx(auVar14,auVar14,10);
  iVar11 = vcvttss2usi_avx512f(auVar14);
  uVar12 = iVar11 << 2;
  auVar14 = vcvtusi2ss_avx512f(auVar19,uVar12);
  auVar19 = vcvtusi2ss_avx512f(auVar19,*(undefined4 *)(model + 0x54));
  iVar11 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar19._0_4_ * auVar14._0_4_)));
  local_58 = (this->super_Score).learning_rate_;
  rVar3 = (this->super_Score).regu_lambda_;
  local_68._4_4_ = rVar3;
  local_68._0_4_ = rVar3;
  fStack_60 = rVar3;
  fStack_5c = rVar3;
  local_6c = 0.0;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,(ulong)uVar12,&local_6c,&local_75);
  lVar8 = *(long *)row;
  if (lVar8 != *(long *)(row + 8)) {
    do {
      uVar5 = *(uint *)(lVar8 + 4);
      if ((uVar5 < uVar4) && (uVar12 != 0)) {
        lVar9 = *(long *)(model + 0x60);
        fVar13 = local_70 * *(float *)(lVar8 + 8);
        uVar10 = 0;
        do {
          pfVar1 = (float *)((ulong)(uVar5 * iVar11) * 4 + lVar9 + uVar10 * 4);
          pfVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10;
          auVar14._0_4_ = fVar13 * *pfVar1 + *pfVar2;
          auVar14._4_4_ = fVar13 * pfVar1[1] + pfVar2[1];
          auVar14._8_4_ = fVar13 * pfVar1[2] + pfVar2[2];
          auVar14._12_4_ = fVar13 * pfVar1[3] + pfVar2[3];
          *(undefined1 (*) [16])
           (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + uVar10) = auVar14;
          uVar10 = uVar10 + 4;
        } while (uVar10 < uVar12);
      }
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != *(long *)(row + 8));
  }
  lVar8 = *(long *)row;
  if (lVar8 != *(long *)(row + 8)) {
    do {
      if ((*(uint *)(lVar8 + 4) < uVar4) && (uVar12 != 0)) {
        lVar9 = (ulong)(*(uint *)(lVar8 + 4) * iVar11) * 4 + *(long *)(model + 0x60);
        fVar13 = local_70 * *(float *)(lVar8 + 8);
        fVar7 = fVar13 * local_74;
        uVar10 = 0;
        do {
          auVar14 = *(undefined1 (*) [16])(lVar9 + uVar10 * 4);
          auVar19._0_4_ = fVar13 * auVar14._0_4_;
          auVar19._4_4_ = fVar13 * auVar14._4_4_;
          auVar19._8_4_ = fVar13 * auVar14._8_4_;
          auVar19._12_4_ = fVar13 * auVar14._12_4_;
          auVar19 = vsubps_avx(*(undefined1 (*) [16])
                                (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar10),auVar19);
          auVar18._0_4_ = local_58 * ((float)local_68._0_4_ * auVar14._0_4_ + fVar7 * auVar19._0_4_)
          ;
          auVar18._4_4_ =
               fStack_54 * ((float)local_68._4_4_ * auVar14._4_4_ + fVar7 * auVar19._4_4_);
          auVar18._8_4_ = fStack_50 * (fStack_60 * auVar14._8_4_ + fVar7 * auVar19._8_4_);
          auVar18._12_4_ = fStack_4c * (fStack_5c * auVar14._12_4_ + fVar7 * auVar19._12_4_);
          auVar14 = vsubps_avx(auVar14,auVar18);
          *(undefined1 (*) [16])(lVar9 + uVar10 * 4) = auVar14;
          uVar10 = uVar10 + 4;
        } while (uVar10 < uVar12);
      }
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != *(long *)(row + 8));
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FMScore::calc_grad_sgd(const SparseRow* row,
                            Model& model,
                            real_t pg,
                            real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/  
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wl -= learning_rate_ * g;
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= learning_rate_ * g;
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
  // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for(index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMg = _mm_add_ps(_mm_mul_ps(XMMlamb, XMMw),
        _mm_mul_ps(XMMpgv, _mm_sub_ps(XMMs,
        _mm_mul_ps(XMMw, XMMv))));
      XMMw = _mm_sub_ps(XMMw, _mm_mul_ps(XMMlr, XMMg));
      _mm_store_ps(w+d, XMMw);
    }
  }
}